

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O3

void __thiscall
spvtools::opt::SENodeSimplifyImpl::GatherAccumulatorsFromChildNodes
          (SENodeSimplifyImpl *this,SENode *new_node,SENode *child,bool negation)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer ppSVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  long lVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  pointer ppSVar11;
  pair<spvtools::opt::SENode_*const,_long> local_38;
  _func_int **pp_Var7;
  
  pp_Var7 = child->_vptr_SENode;
  while( true ) {
    iVar5 = (**pp_Var7)(child);
    if (iVar5 == 0) {
      iVar5 = (*child->_vptr_SENode[4])(child);
      lVar2 = *(long *)(CONCAT44(extraout_var,iVar5) + 0x30);
      lVar8 = -lVar2;
      if ((negation & 1U) == 0) {
        lVar8 = lVar2;
      }
      this->constant_accumulator_ = this->constant_accumulator_ + lVar8;
      return;
    }
    iVar5 = (**child->_vptr_SENode)(child);
    if ((iVar5 == 5) || (iVar5 = (**child->_vptr_SENode)(child), iVar5 == 1)) {
      uVar6 = -(negation & 1) | 1;
      p_Var10 = (this->accumulators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var10 != (_Base_ptr)0x0) {
        p_Var1 = &(this->accumulators_)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = &p_Var1->_M_header;
        do {
          if (*(SENode **)(p_Var10 + 1) >= child) {
            p_Var9 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(SENode **)(p_Var10 + 1) < child];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var9 != p_Var1) && (*(SENode **)(p_Var9 + 1) <= child)) {
          p_Var9[1]._M_parent =
               (_Base_ptr)((long)&(p_Var9[1]._M_parent)->_M_color + (long)(int)uVar6);
          return;
        }
      }
      local_38.second = (long)(int)uVar6;
      local_38.first = child;
      std::
      _Rb_tree<spvtools::opt::SENode*,std::pair<spvtools::opt::SENode*const,long>,std::_Select1st<std::pair<spvtools::opt::SENode*const,long>>,std::less<spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*const,long>>>
      ::_M_insert_unique<std::pair<spvtools::opt::SENode*const,long>>
                ((_Rb_tree<spvtools::opt::SENode*,std::pair<spvtools::opt::SENode*const,long>,std::_Select1st<std::pair<spvtools::opt::SENode*const,long>>,std::less<spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*const,long>>>
                  *)&this->accumulators_,&local_38);
      return;
    }
    iVar5 = (**child->_vptr_SENode)(child);
    if (iVar5 == 3) break;
    iVar5 = (**child->_vptr_SENode)(child);
    if (iVar5 == 2) {
      ppSVar11 = (child->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar3 = (child->children_).
                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar11 == ppSVar3) {
        return;
      }
      do {
        GatherAccumulatorsFromChildNodes(this,new_node,*ppSVar11,(bool)(negation & 1));
        ppSVar11 = ppSVar11 + 1;
      } while (ppSVar11 != ppSVar3);
      return;
    }
    iVar5 = (**child->_vptr_SENode)(child);
    if (iVar5 != 4) goto LAB_0026abc0;
    child = *(child->children_).
             super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    negation = (bool)(negation ^ 1);
    pp_Var7 = child->_vptr_SENode;
  }
  bVar4 = AccumulatorsFromMultiply(this,child,(bool)(negation & 1));
  if (bVar4) {
    return;
  }
LAB_0026abc0:
  (*new_node->_vptr_SENode[3])(new_node,child);
  return;
}

Assistant:

void SENodeSimplifyImpl::GatherAccumulatorsFromChildNodes(SENode* new_node,
                                                          SENode* child,
                                                          bool negation) {
  int32_t sign = negation ? -1 : 1;

  if (child->GetType() == SENode::Constant) {
    // Collect all the constants and add them together.
    constant_accumulator_ +=
        child->AsSEConstantNode()->FoldToSingleValue() * sign;

  } else if (child->GetType() == SENode::ValueUnknown ||
             child->GetType() == SENode::RecurrentAddExpr) {
    // To rebuild the graph of X+X+X*2 into 4*X we count the occurrences of X
    // and create a new node of count*X after. X can either be a ValueUnknown or
    // a RecurrentAddExpr. The count for each X is stored in the accumulators_
    // map.

    auto iterator = accumulators_.find(child);
    // If we've encountered this term before add to the accumulator for it.
    if (iterator == accumulators_.end())
      accumulators_.insert({child, sign});
    else
      iterator->second += sign;

  } else if (child->GetType() == SENode::Multiply) {
    if (!AccumulatorsFromMultiply(child, negation)) {
      new_node->AddChild(child);
    }

  } else if (child->GetType() == SENode::Add) {
    for (SENode* next_child : *child) {
      GatherAccumulatorsFromChildNodes(new_node, next_child, negation);
    }

  } else if (child->GetType() == SENode::Negative) {
    SENode* negated_node = child->GetChild(0);
    GatherAccumulatorsFromChildNodes(new_node, negated_node, !negation);
  } else {
    // If we can't work out how to fold the expression just add it back into
    // the graph.
    new_node->AddChild(child);
  }
}